

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scp_dev.cpp
# Opt level: O3

bool WriteSuperCardPro(string *path,shared_ptr<Disk> *disk)

{
  int iVar1;
  int def_cyls;
  int def_heads;
  exception *this;
  pointer *__ptr;
  shared_ptr<SCPDevDisk> scp_dev_disk;
  _Head_base<0UL,_SuperCardPro_*,_false> local_58;
  SCPDevDisk *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  util::lowercase((string *)&local_40,path);
  iVar1 = std::__cxx11::string::compare(local_40._M_pod_data);
  if ((code **)local_40._M_unused._0_8_ != &local_30) {
    operator_delete(local_40._M_unused._M_object,(ulong)(local_30 + 1));
  }
  if (iVar1 == 0) {
    SuperCardPro::Open();
    if (local_58._M_head_impl == (SuperCardPro *)0x0) {
      this = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[36]>
                (this,(char (*) [36])"failed to open SuperCard Pro device");
      __cxa_throw(this,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
    local_50 = (SCPDevDisk *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<SCPDevDisk,std::allocator<SCPDevDisk>,std::unique_ptr<SuperCardPro,std::default_delete<SuperCardPro>>>
              (&local_48,&local_50,(allocator<SCPDevDisk> *)&local_40,
               (unique_ptr<SuperCardPro,_std::default_delete<SuperCardPro>_> *)&local_58);
    def_cyls = Disk::cyls((Disk *)local_50);
    def_heads = Disk::heads((Disk *)local_50);
    ValidateRange(&opt.range,0x80,2,1,def_cyls,def_heads);
    local_28 = std::
               _Function_handler<void_(const_CylHead_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/types/scp_dev.cpp:159:20)>
               ::_M_invoke;
    local_30 = std::
               _Function_handler<void_(const_CylHead_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/types/scp_dev.cpp:159:20)>
               ::_M_manager;
    local_40._M_unused._M_object = disk;
    local_40._8_8_ = &local_50;
    Range::each(&opt.range,(function<void_(const_CylHead_&)> *)&local_40,false);
    if (local_30 != (code *)0x0) {
      (*local_30)(&local_40,&local_40,3);
    }
    if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
    }
    if (local_58._M_head_impl != (SuperCardPro *)0x0) {
      (*(local_58._M_head_impl)->_vptr_SuperCardPro[1])();
    }
  }
  return iVar1 == 0;
}

Assistant:

bool WriteSuperCardPro(const std::string& path, std::shared_ptr<Disk>& disk)
{
    if (util::lowercase(path) != "scp:")
        return false;

    auto supercardpro = SuperCardPro::Open();
    if (!supercardpro)
        throw util::exception("failed to open SuperCard Pro device");

    auto scp_dev_disk = std::make_shared<SCPDevDisk>(std::move(supercardpro));
    ValidateRange(opt.range, MAX_TRACKS, MAX_SIDES, 1, scp_dev_disk->cyls(), scp_dev_disk->heads());

    opt.range.each([&](const CylHead& cylhead)
        {
            auto trackdata = disk->read(cylhead);
            Message(msgStatus, "Writing %s", CH(cylhead.cyl, cylhead.head));
            scp_dev_disk->write(std::move(trackdata));
        });

    return true;
}